

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Impl::StdString::StartsWith::toString_abi_cxx11_
          (string *__return_storage_ptr__,StartsWith *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::operator+(&local_80,"starts with: \"",&(this->m_data).m_str);
  std::operator+(&local_60,&local_80,"\"");
  CasedString::toStringSuffix_abi_cxx11_(&local_40,&this->m_data);
  std::operator+(__return_storage_ptr__,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
						return "starts with: \"" + m_data.m_str + "\"" + m_data.toStringSuffix();
					}